

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

void __thiscall
kj::_::AttachmentPromiseNode<kj::Own<capnp::LocalClient>_>::~AttachmentPromiseNode
          (AttachmentPromiseNode<kj::Own<capnp::LocalClient>_> *this)

{
  AttachmentPromiseNode<kj::Own<capnp::LocalClient>_> *this_local;
  
  AttachmentPromiseNodeBase::dropDependency(&this->super_AttachmentPromiseNodeBase);
  Own<capnp::LocalClient>::~Own(&this->attachment);
  AttachmentPromiseNodeBase::~AttachmentPromiseNodeBase(&this->super_AttachmentPromiseNodeBase);
  return;
}

Assistant:

~AttachmentPromiseNode() noexcept(false) {
    // We need to make sure the dependency is deleted before we delete the attachment because the
    // dependency may be using the attachment.
    dropDependency();
  }